

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void ResortStates(lemon *lemp)

{
  int iVar1;
  int iVar2;
  state **ppsVar3;
  state *psVar4;
  action *ap;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  action **ppaVar12;
  int iVar13;
  
  uVar6 = lemp->nstate;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar6) {
    uVar10 = (ulong)uVar6;
  }
  ppsVar3 = lemp->sorted;
  do {
    if (uVar9 == uVar10) {
      qsort(ppsVar3 + 1,(long)(int)uVar6 - 1,8,stateResortCompare);
      uVar6 = lemp->nstate;
      uVar9 = 0;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        lemp->sorted[uVar9]->statenum = (int)uVar9;
      }
      uVar7 = 1;
      if ((int)uVar6 < 1) {
        uVar7 = uVar6;
      }
      while ((uVar8 = uVar7, 1 < (int)uVar6 &&
             (uVar8 = uVar6, lemp->sorted[(ulong)uVar6 - 1]->autoReduce != 0))) {
        uVar6 = uVar6 - 1;
      }
      lemp->nxstate = uVar8;
      return;
    }
    psVar4 = ppsVar3[uVar9];
    iVar1 = lemp->nrule;
    psVar4->iDfltReduce = iVar1;
    psVar4->nTknAct = 0;
    psVar4->nNtAct = 0;
    psVar4->iTknOfst = -0x7fffffff;
    psVar4->iNtOfst = -0x7fffffff;
    iVar11 = 0;
    iVar13 = 0;
    ppaVar12 = &psVar4->ap;
    while (ap = *ppaVar12, ap != (action *)0x0) {
      iVar5 = compute_action(lemp,ap);
      if (-1 < iVar5) {
        iVar2 = ap->sp->index;
        if (iVar2 < lemp->nterminal) {
          iVar11 = iVar11 + 1;
          psVar4->nTknAct = iVar11;
        }
        else if (iVar2 < lemp->nsymbol) {
          iVar13 = iVar13 + 1;
          psVar4->nNtAct = iVar13;
        }
        else {
          if ((psVar4->autoReduce != 0) && (psVar4->pDfltReduce != (rule *)(ap->x).stp)) {
            __assert_fail("stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/tools/lemon/lemon.c"
                          ,0x1264,"void ResortStates(struct lemon *)");
          }
          psVar4->iDfltReduce = iVar5 - (uVar6 + iVar1);
        }
      }
      ppaVar12 = &ap->next;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

void ResortStates(struct lemon *lemp)
{
  int i;
  struct state *stp;
  struct action *ap;

  for(i=0; i<lemp->nstate; i++){
    stp = lemp->sorted[i];
    stp->nTknAct = stp->nNtAct = 0;
    stp->iDfltReduce = lemp->nrule;  /* Init dflt action to "syntax error" */
    stp->iTknOfst = NO_OFFSET;
    stp->iNtOfst = NO_OFFSET;
    for(ap=stp->ap; ap; ap=ap->next){
      int iAction = compute_action(lemp,ap);
      if( iAction>=0 ){
        if( ap->sp->index<lemp->nterminal ){
          stp->nTknAct++;
        }else if( ap->sp->index<lemp->nsymbol ){
          stp->nNtAct++;
        }else{
          assert( stp->autoReduce==0 || stp->pDfltReduce==ap->x.rp );
          stp->iDfltReduce = iAction - lemp->nstate - lemp->nrule;
        }
      }
    }
  }
  qsort(&lemp->sorted[1], lemp->nstate-1, sizeof(lemp->sorted[0]),
        stateResortCompare);
  for(i=0; i<lemp->nstate; i++){
    lemp->sorted[i]->statenum = i;
  }
  lemp->nxstate = lemp->nstate;
  while( lemp->nxstate>1 && lemp->sorted[lemp->nxstate-1]->autoReduce ){
    lemp->nxstate--;
  }
}